

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

int HUF_validateCTable(HUF_CElt *CTable,uint *count,uint maxSymbolValue)

{
  int iVar1;
  byte bVar2;
  size_t sVar3;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int s;
  int bad;
  HUF_CElt *ct;
  undefined4 local_28;
  
  bVar2 = 0;
  for (local_28 = 0; local_28 <= in_EDX; local_28 = local_28 + 1) {
    iVar1 = *(int *)(in_RSI + (long)local_28 * 4);
    sVar3 = HUF_getNbBits(*(HUF_CElt *)(in_RDI + 8 + (long)local_28 * 8));
    bVar2 = (iVar1 != 0 && sVar3 == 0) | bVar2;
  }
  return (int)((bVar2 ^ 0xff) & 1);
}

Assistant:

int HUF_validateCTable(const HUF_CElt* CTable, const unsigned* count, unsigned maxSymbolValue) {
  HUF_CElt const* ct = CTable + 1;
  int bad = 0;
  int s;
  for (s = 0; s <= (int)maxSymbolValue; ++s) {
    bad |= (count[s] != 0) & (HUF_getNbBits(ct[s]) == 0);
  }
  return !bad;
}